

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall
QMenuBar::initStyleOption(QMenuBar *this,QStyleOptionMenuItem *option,QAction *action)

{
  State *pSVar1;
  byte *pbVar2;
  QPointer *this_00;
  uint uVar3;
  long lVar4;
  Data *pDVar5;
  qsizetype qVar6;
  char16_t *pcVar7;
  char cVar8;
  bool bVar9;
  QPalette *pQVar10;
  QAction *pQVar11;
  long in_FS_OFFSET;
  QRect QVar12;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0 || option == (QStyleOptionMenuItem *)0x0) goto LAB_0042c81d;
  lVar4 = *(long *)&(this->super_QWidget).field_0x8;
  pQVar10 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&(option->super_QStyleOption).palette,pQVar10);
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    cVar8 = QAction::isEnabled();
    if (cVar8 == '\0') goto LAB_0042c707;
    pSVar1 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  else {
LAB_0042c707:
    (option->super_QStyleOption).palette.currentGroup = Disabled;
  }
  QWidget::fontMetrics((QWidget *)&local_48);
  pDVar5 = *(Data **)&(option->super_QStyleOption).fontMetrics;
  *(Data **)&(option->super_QStyleOption).fontMetrics = local_48.d;
  local_48.d = pDVar5;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  this_00 = (QPointer *)(lVar4 + 0x288);
  bVar9 = QPointer::operator_cast_to_bool(this_00);
  if (bVar9) {
    if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
      pQVar11 = (QAction *)0x0;
    }
    else {
      pQVar11 = *(QAction **)(lVar4 + 0x290);
    }
    if (pQVar11 == action) {
      uVar3 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = uVar3 | 0x8000;
      if (((*(byte *)(lVar4 + 0x2a0) & 1) != 0) && ((*(byte *)(lVar4 + 0x298) & 2) == 0)) {
        (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i = uVar3 | 0x8004;
      }
    }
  }
  bVar9 = QWidget::hasFocus(&this->super_QWidget);
  if (bVar9) {
LAB_0042c7a9:
    pbVar2 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar2 = *pbVar2 | 1;
  }
  else {
    bVar9 = QPointer::operator_cast_to_bool(this_00);
    if (bVar9) goto LAB_0042c7a9;
  }
  QVar12 = QWidget::rect(&this->super_QWidget);
  option->menuRect = QVar12;
  option->menuItemType = Normal;
  option->checkType = NotCheckable;
  QAction::text();
  pDVar5 = (option->text).d.d;
  pcVar7 = (option->text).d.ptr;
  (option->text).d.d = local_48.d;
  (option->text).d.ptr = local_48.ptr;
  qVar6 = (option->text).d.size;
  (option->text).d.size = local_48.size;
  local_48.d = pDVar5;
  local_48.ptr = pcVar7;
  local_48.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QAction::icon();
  QIcon::operator=(&option->icon,(QIcon *)&local_48);
  QIcon::~QIcon((QIcon *)&local_48);
LAB_0042c81d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBar::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;
    Q_D(const QMenuBar);
    option->palette = palette();
    option->state = QStyle::State_None;
    if (isEnabled() && action->isEnabled())
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    option->fontMetrics = fontMetrics();
    if (d->currentAction && d->currentAction == action) {
        option->state |= QStyle::State_Selected;
        if (d->popupState && !d->closePopupMode)
            option->state |= QStyle::State_Sunken;
    }
    if (hasFocus() || d->currentAction)
        option->state |= QStyle::State_HasFocus;
    option->menuRect = rect();
    option->menuItemType = QStyleOptionMenuItem::Normal;
    option->checkType = QStyleOptionMenuItem::NotCheckable;
    option->text = action->text();
    option->icon = action->icon();
}